

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_coords.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  double dVar116;
  double dVar117;
  double dVar118;
  undefined1 auVar119 [16];
  ChStreamOutAscii *pCVar120;
  int iVar121;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  double dVar258;
  double dVar259;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  ChVector<double> mvect1;
  ChVector<double> mvect3;
  ChVector<double> vtraslA;
  ChFrame<double> mframeA;
  ChMatrix33<double> mrotA;
  ChQuaternion<double> qrotA;
  ChFrameMoving<double> mframemovingB1;
  ChFrame<double> f10;
  ChFrame<double> f32;
  ChFrame<double> f21;
  ChFrame<double> tempf;
  ChFrame<double> mframeA1;
  ChFrameMoving<double> testa;
  ChFrameMoving<double> mresg;
  ChQuaternion<double> q32;
  ChQuaternion<double> q21;
  ChVector<double> locpos;
  ChFrameMoving<double> testPl;
  ChCoordsys<double> csysA;
  ChQuaternion<double> q10;
  ChFrameMoving<double> testPw;
  ChFrameMoving<double> bres;
  ChMatrix33<double> m32;
  ChMatrix33<double> m21;
  ChMatrix33<double> m10;
  ChFrameMoving<double> testX;
  ChFrame<double> mresf;
  ChVector<double> local_e70;
  ChVector<double> local_e58;
  ChVector<double> local_e38;
  ChVector<double> local_e20;
  undefined **local_e08;
  double local_e00;
  double local_df8;
  double dStack_df0;
  double local_de8;
  double dStack_de0;
  double dStack_dd8;
  double dStack_dd0;
  ChMatrix33<double> local_dc8;
  ChMatrix33<double> local_d80;
  ChQuaternion<double> local_d38;
  ChFrameMoving<double> local_d18;
  ChFrame<double> local_c20;
  ChFrame<double> local_b98;
  ChFrame<double> local_b10;
  ulong local_a88;
  ulong uStack_a80;
  ChFrame<double> local_a78;
  ChFrame<double> local_9f0;
  ChQuaternion<double> local_968;
  ChFrame<double> local_940;
  ChFrameMoving<double> local_8b8;
  ChFrameMoving<double> local_7c0;
  ChQuaternion<double> local_6c8;
  ChQuaternion<double> local_6a8;
  ChVector<double> local_688;
  ChVector<double> local_670;
  ChFrameMoving<double> local_658;
  ChCoordsys<double> local_560;
  ChQuaternion<double> local_528;
  ChFrame<double> local_508;
  ChFrameMoving<double> local_480;
  ChFrameMoving<double> local_388;
  ChMatrix33<double> local_288;
  ChMatrix33<double> local_240;
  ChMatrix33<double> local_1f8;
  ChFrameMoving<double> local_1b0;
  ChFrame<double> local_b8;
  
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar120,"Copyright (c) 2017 projectchrono.org\nChrono version: ");
  pCVar120 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar120,"7.0.0");
  chrono::ChStreamOutAscii::operator<<(pCVar120,"\n\n");
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<
            (pCVar120,"CHRONO demo about coordinate transformations: \n\n");
  local_e58.m_data[2] = 0.0;
  local_e58.m_data[0] = 0.0;
  local_e58.m_data[1] = 0.0;
  local_e38.m_data[2] = 0.0;
  local_e38.m_data[0] = 0.0;
  local_e38.m_data[1] = 0.0;
  local_e70.m_data[0] = 2.0;
  local_e70.m_data[1] = 3.0;
  local_e70.m_data[2] = 4.0;
  local_e20.m_data[0] = 5.0;
  local_e20.m_data[1] = 6.0;
  local_e20.m_data[2] = 7.0;
  local_d38.m_data[1] = 0.42008402520840293;
  local_d38.m_data[2] = 0.5601120336112039;
  local_d38.m_data[3] = 0.7001400420140048;
  local_d38.m_data[0] = 0.14002800840280097;
  chrono::ChMatrix33<double>::ChMatrix33(&local_d80,&local_d38);
  local_560.pos.m_data[0] = local_e20.m_data[0];
  local_560.pos.m_data[1] = local_e20.m_data[1];
  local_560.pos.m_data[2] = local_e20.m_data[2];
  local_560.rot.m_data[0] = local_d38.m_data[0];
  local_560.rot.m_data[1] = local_d38.m_data[1];
  local_560.rot.m_data[2] = local_d38.m_data[2];
  local_560.rot.m_data[3] = local_d38.m_data[3];
  auVar260._8_8_ = 0;
  auVar260._0_8_ = local_e70.m_data[0];
  auVar122._8_8_ = 0;
  auVar122._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar338._8_8_ = 0;
  auVar338._0_8_ =
       local_e70.m_data[1] *
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar338,auVar260,auVar122);
  auVar357._8_8_ = 0;
  auVar357._0_8_ = local_e70.m_data[2];
  auVar123._8_8_ = 0;
  auVar123._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar357,auVar123);
  auVar125._8_8_ = 0;
  auVar125._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar379._8_8_ = 0;
  auVar379._0_8_ =
       local_e70.m_data[1] *
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar379,auVar260,auVar125);
  auVar124._8_8_ = 0;
  auVar124._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar123 = vfmadd231sd_fma(auVar123,auVar357,auVar124);
  auVar436._8_8_ = 0;
  auVar436._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar306._8_8_ = 0;
  auVar306._0_8_ =
       local_e70.m_data[1] *
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar125 = vfmadd231sd_fma(auVar306,auVar260,auVar436);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar125 = vfmadd231sd_fma(auVar125,auVar357,auVar1);
  local_e58.m_data[0] = local_e20.m_data[0] + auVar122._0_8_;
  local_e58.m_data[1] = local_e20.m_data[1] + auVar123._0_8_;
  local_e58.m_data[2] = local_e20.m_data[2] + auVar125._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using linear algebra, \n");
  dVar259 = local_d38.m_data[0] * local_d38.m_data[0];
  auVar125 = ZEXT816(0xbff0000000000000);
  auVar436 = ZEXT816(0x4000000000000000);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = dVar259 + local_d38.m_data[1] * local_d38.m_data[1];
  auVar122 = vfmadd213sd_fma(auVar261,auVar436,auVar125);
  dVar117 = local_d38.m_data[1] * local_d38.m_data[2] - local_d38.m_data[0] * local_d38.m_data[3];
  auVar410._8_8_ = 0;
  auVar410._0_8_ = local_e70.m_data[0];
  auVar358._8_8_ = 0;
  auVar358._0_8_ = local_e70.m_data[1] * (dVar117 + dVar117);
  auVar122 = vfmadd231sd_fma(auVar358,auVar410,auVar122);
  dVar117 = local_d38.m_data[0] * local_d38.m_data[2] + local_d38.m_data[1] * local_d38.m_data[3];
  auVar425._8_8_ = 0;
  auVar425._0_8_ = local_e70.m_data[2];
  auVar262._8_8_ = 0;
  auVar262._0_8_ = dVar117 + dVar117;
  auVar122 = vfmadd213sd_fma(auVar262,auVar425,auVar122);
  dVar117 = local_d38.m_data[1] * local_d38.m_data[2] + local_d38.m_data[0] * local_d38.m_data[3];
  auVar339._8_8_ = 0;
  auVar339._0_8_ = dVar259 + local_d38.m_data[2] * local_d38.m_data[2];
  auVar123 = vfmadd213sd_fma(auVar339,auVar436,auVar125);
  auVar126._8_8_ = 0;
  auVar126._0_8_ = dVar117 + dVar117;
  auVar340._8_8_ = 0;
  auVar340._0_8_ = local_e70.m_data[1] * auVar123._0_8_;
  auVar123 = vfmadd231sd_fma(auVar340,auVar410,auVar126);
  dVar117 = local_d38.m_data[2] * local_d38.m_data[3] - local_d38.m_data[0] * local_d38.m_data[1];
  auVar127._8_8_ = 0;
  auVar127._0_8_ = dVar117 + dVar117;
  auVar123 = vfmadd213sd_fma(auVar127,auVar425,auVar123);
  dVar118 = local_d38.m_data[1] * local_d38.m_data[3] - local_d38.m_data[0] * local_d38.m_data[2];
  dVar117 = local_d38.m_data[0] * local_d38.m_data[1] + local_d38.m_data[2] * local_d38.m_data[3];
  auVar175._8_8_ = 0;
  auVar175._0_8_ = dVar118 + dVar118;
  auVar307._8_8_ = 0;
  auVar307._0_8_ = local_e70.m_data[1] * (dVar117 + dVar117);
  auVar124 = vfmadd231sd_fma(auVar307,auVar410,auVar175);
  auVar176._8_8_ = 0;
  auVar176._0_8_ = dVar259 + local_d38.m_data[3] * local_d38.m_data[3];
  auVar125 = vfmadd213sd_fma(auVar176,auVar436,auVar125);
  auVar125 = vfmadd213sd_fma(auVar125,auVar425,auVar124);
  local_e58.m_data[0] = auVar122._0_8_ + local_e20.m_data[0];
  local_e58.m_data[1] = auVar123._0_8_ + local_e20.m_data[1];
  local_e58.m_data[2] = auVar125._0_8_ + local_e20.m_data[2];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using quaternion rotation, \n");
  auVar128._8_8_ = 0;
  auVar128._0_8_ = local_e70.m_data[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar212._8_8_ = 0;
  auVar212._0_8_ =
       local_e70.m_data[1] *
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar212,auVar128,auVar2);
  auVar263._8_8_ = 0;
  auVar263._0_8_ = local_e70.m_data[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar263,auVar3);
  local_e58.m_data[0] = auVar122._0_8_ + local_e20.m_data[0];
  auVar4._8_8_ = 0;
  auVar4._0_8_ = local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar308._8_8_ = 0;
  auVar308._0_8_ =
       local_e70.m_data[1] *
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar308,auVar128,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar263,auVar5);
  local_e58.m_data[1] = auVar122._0_8_ + local_e20.m_data[1];
  auVar6._8_8_ = 0;
  auVar6._0_8_ = local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [6];
  auVar177._8_8_ = 0;
  auVar177._0_8_ =
       local_e70.m_data[1] *
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar177,auVar128,auVar6);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar263,auVar7);
  local_e58.m_data[2] = auVar122._0_8_ + local_e20.m_data[2];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using the ChTransform- vect and rot.matrix, \n")
  ;
  chrono::ChTransform<double>::TransformLocalToParent(&local_e70,&local_e20,&local_d38);
  local_e58.m_data[0] = (double)local_d18.super_ChFrame<double>._vptr_ChFrame;
  local_e58.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_e58.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformLocalToParent(&local_560,&local_e70);
  local_e58.m_data[0] = (double)local_d18.super_ChFrame<double>._vptr_ChFrame;
  local_e58.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_e58.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using a ChChCoordsys<> object, \n");
  chrono::ChCoordsys<double>::TransformPointLocalToParent(&local_560,&local_e70);
  local_e58.m_data[0] = (double)local_d18.super_ChFrame<double>._vptr_ChFrame;
  local_e58.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_e58.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using a ChChCoordsys<> \'>>\' operator, \n");
  chrono::ChCoordsys<double>::TransformPointLocalToParent(&local_560,&local_e70);
  local_e58.m_data[0] = (double)local_d18.super_ChFrame<double>._vptr_ChFrame;
  local_e58.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_e58.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using a ChChCoordsys<> \'*\' operator, \n");
  local_e08 = &PTR__ChFrame_0011e7b8;
  local_e00 = local_e20.m_data[0];
  local_df8 = local_e20.m_data[1];
  dStack_df0 = local_e20.m_data[2];
  local_de8 = local_d38.m_data[0];
  dStack_de0 = local_d38.m_data[1];
  dStack_dd8 = local_d38.m_data[2];
  dStack_dd0 = local_d38.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_dc8,&local_d38);
  auVar129._8_8_ = 0;
  auVar129._0_8_ = local_e70.m_data[0];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
  auVar213._8_8_ = 0;
  auVar213._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar213,auVar129,auVar8);
  auVar264._8_8_ = 0;
  auVar264._0_8_ = local_e70.m_data[2];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar264,auVar9);
  local_e58.m_data[0] = auVar122._0_8_ + local_e00;
  auVar10._8_8_ = 0;
  auVar10._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar309._8_8_ = 0;
  auVar309._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar309,auVar129,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar264,auVar11);
  local_e58.m_data[1] = auVar122._0_8_ + local_df8;
  auVar12._8_8_ = 0;
  auVar12._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar178._8_8_ = 0;
  auVar178._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar178,auVar129,auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar264,auVar13);
  local_e58.m_data[2] = auVar122._0_8_ + dStack_df0;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using a ChFrame object function, \n");
  auVar130._8_8_ = 0;
  auVar130._0_8_ = local_e70.m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar214._8_8_ = 0;
  auVar214._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar214,auVar130,auVar14);
  auVar265._8_8_ = 0;
  auVar265._0_8_ = local_e70.m_data[2];
  auVar15._8_8_ = 0;
  auVar15._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar265,auVar15);
  local_e58.m_data[0] = auVar122._0_8_ + local_e00;
  auVar16._8_8_ = 0;
  auVar16._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar310._8_8_ = 0;
  auVar310._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar310,auVar130,auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar265,auVar17);
  local_e58.m_data[1] = auVar122._0_8_ + local_df8;
  auVar18._8_8_ = 0;
  auVar18._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar179._8_8_ = 0;
  auVar179._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar179,auVar130,auVar18);
  auVar19._8_8_ = 0;
  auVar19._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar265,auVar19);
  local_e58.m_data[2] = auVar122._0_8_ + dStack_df0;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using a ChFrame \'>>\' operator, \n");
  auVar131._8_8_ = 0;
  auVar131._0_8_ = local_e70.m_data[0];
  auVar20._8_8_ = 0;
  auVar20._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar215._8_8_ = 0;
  auVar215._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar215,auVar131,auVar20);
  auVar266._8_8_ = 0;
  auVar266._0_8_ = local_e70.m_data[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar266,auVar21);
  local_e58.m_data[0] = auVar122._0_8_ + local_e00;
  auVar22._8_8_ = 0;
  auVar22._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar311._8_8_ = 0;
  auVar311._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar311,auVar131,auVar22);
  auVar23._8_8_ = 0;
  auVar23._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar266,auVar23);
  local_e58.m_data[1] = auVar122._0_8_ + local_df8;
  auVar24._8_8_ = 0;
  auVar24._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar180._8_8_ = 0;
  auVar180._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar180,auVar131,auVar24);
  auVar25._8_8_ = 0;
  auVar25._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar266,auVar25);
  local_e58.m_data[2] = auVar122._0_8_ + dStack_df0;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e58);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..using a ChFrame \'*\' operator, \n");
  local_528.m_data[1] = 0.42008402520840293;
  local_528.m_data[2] = 0.5601120336112039;
  local_528.m_data[3] = 0.7001400420140048;
  local_528.m_data[0] = 0.14002800840280097;
  chrono::ChMatrix33<double>::ChMatrix33(&local_1f8,&local_528);
  local_6a8.m_data[1] = 0.32025630761017426;
  local_6a8.m_data[2] = 0.16012815380508713;
  local_6a8.m_data[3] = 0.8006407690254357;
  local_6a8.m_data[0] = 0.48038446141526137;
  chrono::ChMatrix33<double>::ChMatrix33(&local_240,&local_6a8);
  local_6c8.m_data[1] = 0.19245008972987526;
  local_6c8.m_data[2] = 0.5773502691896257;
  local_6c8.m_data[3] = 0.19245008972987526;
  local_6c8.m_data[0] = 0.769800358919501;
  chrono::ChMatrix33<double>::ChMatrix33(&local_288,&local_6c8);
  auVar132._8_8_ = 0;
  auVar132._0_8_ = local_e70.m_data[0];
  auVar26._8_8_ = 0;
  auVar26._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar216._8_8_ = 0;
  auVar216._0_8_ =
       local_e70.m_data[1] *
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar216,auVar132,auVar26);
  auVar267._8_8_ = 0;
  auVar267._0_8_ = local_e70.m_data[2];
  auVar27._8_8_ = 0;
  auVar27._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar267,auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar312._8_8_ = 0;
  auVar312._0_8_ =
       local_e70.m_data[1] *
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar312,auVar132,auVar28);
  auVar29._8_8_ = 0;
  auVar29._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar123 = vfmadd231sd_fma(auVar123,auVar267,auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar181._8_8_ = 0;
  auVar181._0_8_ =
       local_e70.m_data[1] *
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar125 = vfmadd231sd_fma(auVar181,auVar132,auVar30);
  auVar31._8_8_ = 0;
  auVar31._0_8_ =
       local_288.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar125 = vfmadd231sd_fma(auVar125,auVar267,auVar31);
  dVar117 = auVar122._0_8_ + 1.0;
  dVar259 = auVar123._0_8_ + 5.0;
  dVar118 = auVar125._0_8_ + 1.0;
  auVar32._8_8_ = 0;
  auVar32._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar217._8_8_ = 0;
  auVar217._0_8_ = dVar117;
  auVar341._8_8_ = 0;
  auVar341._0_8_ =
       dVar259 * local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar122 = vfmadd231sd_fma(auVar341,auVar217,auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar182._8_8_ = 0;
  auVar182._0_8_ = dVar118;
  auVar122 = vfmadd231sd_fma(auVar122,auVar182,auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar359._8_8_ = 0;
  auVar359._0_8_ =
       dVar259 * local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar359,auVar217,auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar123 = vfmadd231sd_fma(auVar123,auVar182,auVar35);
  auVar36._8_8_ = 0;
  auVar36._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar218._8_8_ = 0;
  auVar218._0_8_ = dVar117;
  auVar313._8_8_ = 0;
  auVar313._0_8_ =
       dVar259 * local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar125 = vfmadd231sd_fma(auVar313,auVar218,auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ =
       local_240.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar183._8_8_ = 0;
  auVar183._0_8_ = dVar118;
  auVar125 = vfmadd231sd_fma(auVar125,auVar183,auVar37);
  dVar117 = auVar122._0_8_ + 4.0;
  dVar259 = auVar123._0_8_ + 1.0;
  dVar118 = auVar125._0_8_ + 3.0;
  auVar38._8_8_ = 0;
  auVar38._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar184._8_8_ = 0;
  auVar184._0_8_ = dVar117;
  auVar314._8_8_ = 0;
  auVar314._0_8_ =
       dVar259 * local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar122 = vfmadd231sd_fma(auVar314,auVar184,auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar219._8_8_ = 0;
  auVar219._0_8_ = dVar118;
  auVar122 = vfmadd231sd_fma(auVar122,auVar219,auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar342._8_8_ = 0;
  auVar342._0_8_ =
       dVar259 * local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar342,auVar184,auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar123 = vfmadd231sd_fma(auVar123,auVar219,auVar41);
  auVar42._8_8_ = 0;
  auVar42._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar133._8_8_ = 0;
  auVar133._0_8_ =
       dVar259 * local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar185._8_8_ = 0;
  auVar185._0_8_ = dVar117;
  auVar125 = vfmadd231sd_fma(auVar133,auVar185,auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ =
       local_1f8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar220._8_8_ = 0;
  auVar220._0_8_ = dVar118;
  auVar125 = vfmadd231sd_fma(auVar125,auVar220,auVar43);
  local_e38.m_data[0] = auVar122._0_8_ + 5.0;
  local_e38.m_data[1] = auVar123._0_8_ + 6.0;
  local_e38.m_data[2] = auVar125._0_8_ + 7.0;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e38);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..triple trsf. using linear algebra, \n");
  local_c20._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  local_c20.coord.pos.m_data[0] = 5.0;
  local_c20.coord.pos.m_data[1] = 6.0;
  local_c20.coord.pos.m_data[2] = 7.0;
  local_c20.coord.rot.m_data[0] = local_528.m_data[0];
  local_c20.coord.rot.m_data[1] = local_528.m_data[1];
  local_c20.coord.rot.m_data[2] = local_528.m_data[2];
  local_c20.coord.rot.m_data[3] = local_528.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_c20.Amatrix,&local_528);
  local_b10._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  local_b10.coord.pos.m_data[0] = 4.0;
  local_b10.coord.pos.m_data[1] = 1.0;
  local_b10.coord.pos.m_data[2] = 3.0;
  local_b10.coord.rot.m_data[0] = local_6a8.m_data[0];
  local_b10.coord.rot.m_data[1] = local_6a8.m_data[1];
  local_b10.coord.rot.m_data[2] = local_6a8.m_data[2];
  local_b10.coord.rot.m_data[3] = local_6a8.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_b10.Amatrix,&local_6a8);
  local_b98._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  local_b98.coord.pos.m_data[0] = 1.0;
  local_b98.coord.pos.m_data[1] = 5.0;
  local_b98.coord.pos.m_data[2] = 1.0;
  local_b98.coord.rot.m_data[0] = local_6c8.m_data[0];
  local_b98.coord.rot.m_data[1] = local_6c8.m_data[1];
  local_b98.coord.rot.m_data[2] = local_6c8.m_data[2];
  local_b98.coord.rot.m_data[3] = local_6c8.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_b98.Amatrix,&local_6c8);
  auVar134._8_8_ = 0;
  auVar134._0_8_ = local_e70.m_data[0];
  auVar44._8_8_ = 0;
  auVar44._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar221._8_8_ = 0;
  auVar221._0_8_ =
       local_e70.m_data[1] *
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar221,auVar134,auVar44);
  auVar268._8_8_ = 0;
  auVar268._0_8_ = local_e70.m_data[2];
  auVar45._8_8_ = 0;
  auVar45._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar268,auVar45);
  dVar117 = auVar122._0_8_ + local_b98.coord.pos.m_data[0];
  auVar46._8_8_ = 0;
  auVar46._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar315._8_8_ = 0;
  auVar315._0_8_ =
       local_e70.m_data[1] *
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar315,auVar134,auVar46);
  auVar47._8_8_ = 0;
  auVar47._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar268,auVar47);
  dVar259 = auVar122._0_8_ + local_b98.coord.pos.m_data[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar186._8_8_ = 0;
  auVar186._0_8_ =
       local_e70.m_data[1] *
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar186,auVar134,auVar48);
  auVar49._8_8_ = 0;
  auVar49._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar268,auVar49);
  dVar118 = auVar122._0_8_ + local_b98.coord.pos.m_data[2];
  auVar50._8_8_ = 0;
  auVar50._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar187._8_8_ = 0;
  auVar187._0_8_ =
       dVar259 * local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar222._8_8_ = 0;
  auVar222._0_8_ = dVar117;
  auVar122 = vfmadd231sd_fma(auVar187,auVar222,auVar50);
  auVar51._8_8_ = 0;
  auVar51._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar135._8_8_ = 0;
  auVar135._0_8_ = dVar118;
  auVar122 = vfmadd231sd_fma(auVar122,auVar135,auVar51);
  dVar116 = auVar122._0_8_ + local_b10.coord.pos.m_data[0];
  auVar52._8_8_ = 0;
  auVar52._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar269._8_8_ = 0;
  auVar269._0_8_ =
       dVar259 * local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar122 = vfmadd231sd_fma(auVar269,auVar222,auVar52);
  auVar53._8_8_ = 0;
  auVar53._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar135,auVar53);
  dVar258 = auVar122._0_8_ + local_b10.coord.pos.m_data[1];
  auVar54._8_8_ = 0;
  auVar54._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar223._8_8_ = 0;
  auVar223._0_8_ = dVar117;
  auVar316._8_8_ = 0;
  auVar316._0_8_ =
       dVar259 * local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar122 = vfmadd231sd_fma(auVar316,auVar223,auVar54);
  auVar55._8_8_ = 0;
  auVar55._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar136._8_8_ = 0;
  auVar136._0_8_ = dVar118;
  auVar122 = vfmadd231sd_fma(auVar122,auVar136,auVar55);
  dVar117 = auVar122._0_8_ + local_b10.coord.pos.m_data[2];
  auVar56._8_8_ = 0;
  auVar56._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar188._8_8_ = 0;
  auVar188._0_8_ = dVar116;
  auVar224._8_8_ = 0;
  auVar224._0_8_ =
       dVar258 * local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [1];
  auVar122 = vfmadd231sd_fma(auVar224,auVar188,auVar56);
  auVar57._8_8_ = 0;
  auVar57._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar137._8_8_ = 0;
  auVar137._0_8_ = dVar117;
  auVar122 = vfmadd231sd_fma(auVar122,auVar137,auVar57);
  local_e38.m_data[0] = auVar122._0_8_ + local_c20.coord.pos.m_data[0];
  auVar58._8_8_ = 0;
  auVar58._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar317._8_8_ = 0;
  auVar317._0_8_ =
       dVar258 * local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar122 = vfmadd231sd_fma(auVar317,auVar188,auVar58);
  auVar59._8_8_ = 0;
  auVar59._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar137,auVar59);
  local_e38.m_data[1] = auVar122._0_8_ + local_c20.coord.pos.m_data[1];
  auVar60._8_8_ = 0;
  auVar60._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar189._8_8_ = 0;
  auVar189._0_8_ = dVar116;
  auVar270._8_8_ = 0;
  auVar270._0_8_ =
       dVar258 * local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [7];
  auVar122 = vfmadd231sd_fma(auVar270,auVar189,auVar60);
  auVar61._8_8_ = 0;
  auVar61._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar138._8_8_ = 0;
  auVar138._0_8_ = dVar117;
  auVar122 = vfmadd231sd_fma(auVar122,auVar138,auVar61);
  local_e38.m_data[2] = auVar122._0_8_ + local_c20.coord.pos.m_data[2];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e38);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..triple vector trsf. with ChFrame \'>>\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_7c0.super_ChFrame<double>,&local_c20,&local_b10);
  chrono::ChFrame<double>::operator*
            (&local_d18.super_ChFrame<double>,&local_7c0.super_ChFrame<double>,&local_b98);
  auVar139._8_8_ = 0;
  auVar139._0_8_ = local_e70.m_data[0];
  auVar62._8_8_ = 0;
  auVar62._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar225._8_8_ = 0;
  auVar225._0_8_ =
       local_e70.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar225,auVar139,auVar62);
  auVar271._8_8_ = 0;
  auVar271._0_8_ = local_e70.m_data[2];
  auVar63._8_8_ = 0;
  auVar63._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar271,auVar63);
  local_e38.m_data[0] = auVar122._0_8_ + local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  auVar64._8_8_ = 0;
  auVar64._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar318._8_8_ = 0;
  auVar318._0_8_ =
       local_e70.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar318,auVar139,auVar64);
  auVar65._8_8_ = 0;
  auVar65._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar271,auVar65);
  local_e38.m_data[1] = auVar122._0_8_ + local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  auVar66._8_8_ = 0;
  auVar66._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar190._8_8_ = 0;
  auVar190._0_8_ =
       local_e70.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar190,auVar139,auVar66);
  auVar67._8_8_ = 0;
  auVar67._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar271,auVar67);
  local_e38.m_data[2] = auVar122._0_8_ + local_d18.super_ChFrame<double>.coord.pos.m_data[2];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e38);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  chrono::ChFrame<double>::operator*(&local_d18.super_ChFrame<double>,&local_c20,&local_b10);
  chrono::ChFrame<double>::operator*(&local_9f0,&local_d18.super_ChFrame<double>,&local_b98);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = local_e70.m_data[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ =
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar226._8_8_ = 0;
  auVar226._0_8_ =
       local_e70.m_data[1] *
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar226,auVar140,auVar68);
  auVar272._8_8_ = 0;
  auVar272._0_8_ = local_e70.m_data[2];
  auVar69._8_8_ = 0;
  auVar69._0_8_ =
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar272,auVar69);
  local_e38.m_data[0] = auVar122._0_8_ + local_9f0.coord.pos.m_data[0];
  auVar70._8_8_ = 0;
  auVar70._0_8_ =
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar319._8_8_ = 0;
  auVar319._0_8_ =
       local_e70.m_data[1] *
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar319,auVar140,auVar70);
  auVar71._8_8_ = 0;
  auVar71._0_8_ =
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar272,auVar71);
  local_e38.m_data[1] = auVar122._0_8_ + local_9f0.coord.pos.m_data[1];
  auVar72._8_8_ = 0;
  auVar72._0_8_ =
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar191._8_8_ = 0;
  auVar191._0_8_ =
       local_e70.m_data[1] *
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar191,auVar140,auVar72);
  auVar73._8_8_ = 0;
  auVar73._0_8_ =
       local_9f0.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar272,auVar73);
  local_e38.m_data[2] = auVar122._0_8_ + local_9f0.coord.pos.m_data[2];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e38);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..triple vector trsf. with ChFrame \'*\' operator, \n");
  local_d18.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_d18.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_d18.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_d18.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_508._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  local_508.coord.pos.m_data[0] = local_e70.m_data[0];
  local_508.coord.pos.m_data[1] = local_e70.m_data[1];
  local_508.coord.pos.m_data[2] = local_e70.m_data[2];
  local_508.coord.rot.m_data[0] = 1.0;
  local_508.coord.rot.m_data[1] = 0.0;
  local_508.coord.rot.m_data[2] = 0.0;
  local_508.coord.rot.m_data[3] = 0.0;
  chrono::ChMatrix33<double>::ChMatrix33(&local_508.Amatrix,(ChQuaternion<double> *)&local_d18);
  local_d18.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_d18.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_d18.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_d18.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  local_a78._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  local_a78.coord.pos.m_data[0] = 0.0;
  local_a78.coord.pos.m_data[1] = 0.0;
  local_a78.coord.pos.m_data[2] = 0.0;
  local_a78.coord.rot.m_data[0] = 1.0;
  local_a78.coord.rot.m_data[1] = 0.0;
  local_a78.coord.rot.m_data[2] = 0.0;
  local_a78.coord.rot.m_data[3] = 0.0;
  chrono::ChMatrix33<double>::ChMatrix33(&local_a78.Amatrix,(ChQuaternion<double> *)&local_d18);
  chrono::ChFrame<double>::operator>>(&local_8b8.super_ChFrame<double>,&local_508,&local_b98);
  chrono::ChFrame<double>::operator>>
            (&local_7c0.super_ChFrame<double>,&local_8b8.super_ChFrame<double>,&local_b10);
  chrono::ChFrame<double>::operator>>
            (&local_d18.super_ChFrame<double>,&local_7c0.super_ChFrame<double>,&local_c20);
  local_a78.coord.pos.m_data[0] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_a78.coord.pos.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  local_a78.coord.pos.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[2];
  local_a78.coord.rot.m_data[0] = local_d18.super_ChFrame<double>.coord.rot.m_data[0];
  local_a78.coord.rot.m_data[1] = local_d18.super_ChFrame<double>.coord.rot.m_data[1];
  local_a78.coord.rot.m_data[2] = local_d18.super_ChFrame<double>.coord.rot.m_data[2];
  local_a78.coord.rot.m_data[3] = local_d18.super_ChFrame<double>.coord.rot.m_data[3];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_a78);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..triple frame trsf. with ChFrame \'>>\' operator,  \n");
  chrono::ChFrame<double>::operator*(&local_8b8.super_ChFrame<double>,&local_c20,&local_b10);
  chrono::ChFrame<double>::operator*
            (&local_7c0.super_ChFrame<double>,&local_8b8.super_ChFrame<double>,&local_b98);
  chrono::ChFrame<double>::operator*
            (&local_d18.super_ChFrame<double>,&local_7c0.super_ChFrame<double>,&local_508);
  local_a78.coord.pos.m_data[0] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_a78.coord.pos.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  local_a78.coord.pos.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[2];
  local_a78.coord.rot.m_data[0] = local_d18.super_ChFrame<double>.coord.rot.m_data[0];
  local_a78.coord.rot.m_data[1] = local_d18.super_ChFrame<double>.coord.rot.m_data[1];
  local_a78.coord.rot.m_data[2] = local_d18.super_ChFrame<double>.coord.rot.m_data[2];
  local_a78.coord.rot.m_data[3] = local_d18.super_ChFrame<double>.coord.rot.m_data[3];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_a78.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_a78);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..triple frame trsf. with ChFrame \'*\' operator,  \n");
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_8b8,&local_b98.coord,&local_508.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_7c0,&local_b10.coord,(ChCoordsys<double> *)&local_8b8);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_d18,&local_c20.coord,(ChCoordsys<double> *)&local_7c0);
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_a78);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..triple frame trsf. with ChCoordsys \'>>\' operator,  \n");
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_8b8,&local_c20.coord,&local_b10.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_7c0,(ChCoordsys<double> *)&local_8b8,&local_b98.coord);
  chrono::ChCoordsys<double>::TransformLocalToParent
            ((ChCoordsys<double> *)&local_d18,(ChCoordsys<double> *)&local_7c0,&local_508.coord);
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_a78);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..triple frame trsf. with ChCoordsys \'*\' operator,  \n");
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..mvect1 \n");
  dVar117 = local_e58.m_data[1] - local_e20.m_data[1];
  auVar74._8_8_ = 0;
  auVar74._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar141._8_8_ = 0;
  auVar141._0_8_ = local_e58.m_data[0] - local_e20.m_data[0];
  auVar273._8_8_ = 0;
  auVar273._0_8_ =
       dVar117 * local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar122 = vfmadd231sd_fma(auVar273,auVar141,auVar74);
  auVar75._8_8_ = 0;
  auVar75._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar227._8_8_ = 0;
  auVar227._0_8_ = local_e58.m_data[2] - local_e20.m_data[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar227,auVar75);
  auVar76._8_8_ = 0;
  auVar76._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar320._8_8_ = 0;
  auVar320._0_8_ =
       dVar117 * local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar320,auVar141,auVar76);
  auVar77._8_8_ = 0;
  auVar77._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar227,auVar77);
  auVar78._8_8_ = 0;
  auVar78._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar142._8_8_ = 0;
  auVar142._0_8_ = local_e58.m_data[0] - local_e20.m_data[0];
  auVar192._8_8_ = 0;
  auVar192._0_8_ =
       dVar117 * local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar125 = vfmadd231sd_fma(auVar192,auVar142,auVar78);
  auVar79._8_8_ = 0;
  auVar79._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar228._8_8_ = 0;
  auVar228._0_8_ = local_e58.m_data[2] - local_e20.m_data[2];
  auVar125 = vfmadd231sd_fma(auVar125,auVar228,auVar79);
  local_e70.m_data[0] = auVar122._0_8_;
  local_e70.m_data[1] = auVar123._0_8_;
  local_e70.m_data[2] = auVar125._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv, using linear algebra, \n");
  dVar118 = local_e58.m_data[1] - local_e20.m_data[1];
  auVar274._8_8_ = 0;
  auVar274._0_8_ = local_d38.m_data[0];
  dVar259 = local_d38.m_data[0] * local_d38.m_data[0];
  auVar119._8_8_ = 0x8000000000000000;
  auVar119._0_8_ = 0x8000000000000000;
  auVar122 = vxorpd_avx512vl(auVar274,auVar119);
  dVar258 = auVar122._0_8_;
  auVar125 = ZEXT816(0xbff0000000000000);
  auVar436 = ZEXT816(0x4000000000000000);
  auVar360._8_8_ = 0;
  auVar360._0_8_ = dVar259 + local_d38.m_data[1] * local_d38.m_data[1];
  auVar122 = vfmadd213sd_fma(auVar360,auVar436,auVar125);
  dVar117 = local_d38.m_data[1] * local_d38.m_data[2] - local_d38.m_data[3] * dVar258;
  auVar143._8_8_ = 0;
  auVar143._0_8_ = local_e58.m_data[0] - local_e20.m_data[0];
  auVar395._8_8_ = 0;
  auVar395._0_8_ = (dVar117 + dVar117) * dVar118;
  auVar122 = vfmadd231sd_fma(auVar395,auVar143,auVar122);
  dVar117 = local_d38.m_data[2] * dVar258 + local_d38.m_data[3] * local_d38.m_data[1];
  auVar229._8_8_ = 0;
  auVar229._0_8_ = local_e58.m_data[2] - local_e20.m_data[2];
  auVar361._8_8_ = 0;
  auVar361._0_8_ = dVar117 + dVar117;
  auVar122 = vfmadd213sd_fma(auVar361,auVar229,auVar122);
  dVar117 = local_d38.m_data[1] * local_d38.m_data[2] + local_d38.m_data[3] * dVar258;
  auVar388._8_8_ = 0;
  auVar388._0_8_ = local_d38.m_data[2] * local_d38.m_data[2] + dVar259;
  auVar123 = vfmadd213sd_fma(auVar388,auVar436,auVar125);
  auVar275._8_8_ = 0;
  auVar275._0_8_ = dVar117 + dVar117;
  auVar389._8_8_ = 0;
  auVar389._0_8_ = auVar123._0_8_ * dVar118;
  auVar123 = vfmadd231sd_fma(auVar389,auVar143,auVar275);
  dVar117 = local_d38.m_data[3] * local_d38.m_data[2] - local_d38.m_data[1] * dVar258;
  auVar276._8_8_ = 0;
  auVar276._0_8_ = dVar117 + dVar117;
  auVar123 = vfmadd213sd_fma(auVar276,auVar229,auVar123);
  dVar116 = local_d38.m_data[3] * local_d38.m_data[1] - local_d38.m_data[2] * dVar258;
  dVar117 = local_d38.m_data[1] * dVar258 + local_d38.m_data[3] * local_d38.m_data[2];
  auVar144._8_8_ = 0;
  auVar144._0_8_ = local_e58.m_data[0] - local_e20.m_data[0];
  auVar193._8_8_ = 0;
  auVar193._0_8_ = dVar118 * (dVar117 + dVar117);
  auVar321._8_8_ = 0;
  auVar321._0_8_ = dVar116 + dVar116;
  auVar124 = vfmadd231sd_fma(auVar193,auVar144,auVar321);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = local_d38.m_data[3] * local_d38.m_data[3] + dVar259;
  auVar125 = vfmadd213sd_fma(auVar145,auVar436,auVar125);
  auVar230._8_8_ = 0;
  auVar230._0_8_ = local_e58.m_data[2] - local_e20.m_data[2];
  auVar125 = vfmadd213sd_fma(auVar125,auVar230,auVar124);
  local_e70.m_data[0] = auVar122._0_8_;
  local_e70.m_data[1] = auVar123._0_8_;
  local_e70.m_data[2] = auVar125._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv, using quaternion rotation, \n");
  dVar117 = local_e58.m_data[1] - local_e20.m_data[1];
  auVar80._8_8_ = 0;
  auVar80._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar146._8_8_ = 0;
  auVar146._0_8_ = local_e58.m_data[0] - local_e20.m_data[0];
  auVar277._8_8_ = 0;
  auVar277._0_8_ =
       dVar117 * local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar122 = vfmadd231sd_fma(auVar277,auVar146,auVar80);
  auVar81._8_8_ = 0;
  auVar81._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar231._8_8_ = 0;
  auVar231._0_8_ = local_e58.m_data[2] - local_e20.m_data[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar231,auVar81);
  auVar82._8_8_ = 0;
  auVar82._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar322._8_8_ = 0;
  auVar322._0_8_ =
       dVar117 * local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar322,auVar146,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar231,auVar83);
  auVar84._8_8_ = 0;
  auVar84._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar147._8_8_ = 0;
  auVar147._0_8_ = local_e58.m_data[0] - local_e20.m_data[0];
  auVar194._8_8_ = 0;
  auVar194._0_8_ =
       dVar117 * local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar125 = vfmadd231sd_fma(auVar194,auVar147,auVar84);
  auVar85._8_8_ = 0;
  auVar85._0_8_ =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar232._8_8_ = 0;
  auVar232._0_8_ = local_e58.m_data[2] - local_e20.m_data[2];
  auVar125 = vfmadd231sd_fma(auVar125,auVar232,auVar85);
  local_e70.m_data[0] = auVar122._0_8_;
  local_e70.m_data[1] = auVar123._0_8_;
  local_e70.m_data[2] = auVar125._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..inv, using the ChTransform- vect and rot.matrix, \n");
  chrono::ChTransform<double>::TransformParentToLocal(&local_e58,&local_e20,&local_d38);
  local_e70.m_data[0] = (double)local_d18.super_ChFrame<double>._vptr_ChFrame;
  local_e70.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_e70.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv, using the ChTransform- vect and quat, \n");
  chrono::ChCoordsys<double>::TransformParentToLocal(&local_560,&local_e58);
  local_e70.m_data[0] = (double)local_d18.super_ChFrame<double>._vptr_ChFrame;
  local_e70.m_data[1] = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  local_e70.m_data[2] = local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv, using a ChChCoordsys<> object, \n");
  dVar117 = local_e58.m_data[1] - local_df8;
  auVar86._8_8_ = 0;
  auVar86._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar148._8_8_ = 0;
  auVar148._0_8_ = local_e58.m_data[0] - local_e00;
  auVar278._8_8_ = 0;
  auVar278._0_8_ =
       dVar117 * local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar122 = vfmadd231sd_fma(auVar278,auVar148,auVar86);
  auVar87._8_8_ = 0;
  auVar87._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar233._8_8_ = 0;
  auVar233._0_8_ = local_e58.m_data[2] - dStack_df0;
  auVar122 = vfmadd231sd_fma(auVar122,auVar233,auVar87);
  auVar88._8_8_ = 0;
  auVar88._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar323._8_8_ = 0;
  auVar323._0_8_ =
       dVar117 * local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar323,auVar148,auVar88);
  auVar89._8_8_ = 0;
  auVar89._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar233,auVar89);
  auVar90._8_8_ = 0;
  auVar90._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar149._8_8_ = 0;
  auVar149._0_8_ = local_e58.m_data[0] - local_e00;
  auVar195._8_8_ = 0;
  auVar195._0_8_ =
       dVar117 * local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar125 = vfmadd231sd_fma(auVar195,auVar149,auVar90);
  auVar91._8_8_ = 0;
  auVar91._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar234._8_8_ = 0;
  auVar234._0_8_ = local_e58.m_data[2] - dStack_df0;
  auVar125 = vfmadd231sd_fma(auVar125,auVar234,auVar91);
  local_e70.m_data[0] = auVar122._0_8_;
  local_e70.m_data[1] = auVar123._0_8_;
  local_e70.m_data[2] = auVar125._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv, using a ChFrame object function, \n");
  auVar150._8_8_ = 0;
  auVar150._0_8_ = local_e00;
  auVar235._8_8_ = 0;
  auVar235._0_8_ = dStack_df0;
  auVar279._8_8_ = 0;
  auVar279._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar324._8_8_ = 0;
  auVar324._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar343._8_8_ = 0;
  auVar343._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar396._8_8_ = 0;
  auVar396._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar402._8_8_ = 0;
  auVar402._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar411._8_8_ = 0;
  auVar411._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar417._8_8_ = 0;
  auVar417._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_df8;
  auVar122 = vfmadd231sd_fma(auVar417,auVar343,auVar150);
  auVar122 = vfmadd231sd_fma(auVar122,auVar411,auVar235);
  auVar426._8_8_ = 0;
  auVar426._0_8_ =
       local_df8 *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar426,auVar324,auVar150);
  auVar123 = vfmadd231sd_fma(auVar123,auVar402,auVar235);
  auVar196._8_8_ = 0;
  auVar196._0_8_ =
       local_df8 *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar125 = vfmadd231sd_fma(auVar196,auVar279,auVar150);
  auVar125 = vfmadd231sd_fma(auVar125,auVar396,auVar235);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = local_e58.m_data[0];
  auVar362._8_8_ = 0;
  auVar362._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e58.m_data[1];
  auVar124 = vfmadd231sd_fma(auVar362,auVar151,auVar279);
  auVar280._8_8_ = 0;
  auVar280._0_8_ = local_e58.m_data[2];
  auVar124 = vfmadd231sd_fma(auVar124,auVar280,auVar396);
  local_e70.m_data[0] = auVar124._0_8_ - auVar125._0_8_;
  auVar363._8_8_ = 0;
  auVar363._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e58.m_data[1];
  auVar125 = vfmadd231sd_fma(auVar363,auVar151,auVar324);
  auVar125 = vfmadd231sd_fma(auVar125,auVar280,auVar402);
  local_e70.m_data[1] = auVar125._0_8_ - auVar123._0_8_;
  auVar236._8_8_ = 0;
  auVar236._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e58.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar236,auVar343,auVar151);
  auVar123 = vfmadd231sd_fma(auVar123,auVar411,auVar280);
  local_e70.m_data[2] = auVar123._0_8_ - auVar122._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..inv, using a ChFrame inverse and \'>>\' operator, \n");
  auVar152._8_8_ = 0;
  auVar152._0_8_ = local_e00;
  auVar237._8_8_ = 0;
  auVar237._0_8_ = dStack_df0;
  auVar281._8_8_ = 0;
  auVar281._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar325._8_8_ = 0;
  auVar325._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar344._8_8_ = 0;
  auVar344._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar397._8_8_ = 0;
  auVar397._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar403._8_8_ = 0;
  auVar403._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar412._8_8_ = 0;
  auVar412._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar418._8_8_ = 0;
  auVar418._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_df8;
  auVar122 = vfmadd231sd_fma(auVar418,auVar344,auVar152);
  auVar122 = vfmadd231sd_fma(auVar122,auVar412,auVar237);
  auVar427._8_8_ = 0;
  auVar427._0_8_ =
       local_df8 *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar427,auVar325,auVar152);
  auVar123 = vfmadd231sd_fma(auVar123,auVar403,auVar237);
  auVar197._8_8_ = 0;
  auVar197._0_8_ =
       local_df8 *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar125 = vfmadd231sd_fma(auVar197,auVar281,auVar152);
  auVar125 = vfmadd231sd_fma(auVar125,auVar397,auVar237);
  auVar153._8_8_ = 0;
  auVar153._0_8_ = local_e58.m_data[0];
  auVar364._8_8_ = 0;
  auVar364._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e58.m_data[1];
  auVar124 = vfmadd231sd_fma(auVar364,auVar153,auVar281);
  auVar282._8_8_ = 0;
  auVar282._0_8_ = local_e58.m_data[2];
  auVar124 = vfmadd231sd_fma(auVar124,auVar282,auVar397);
  local_e70.m_data[0] = auVar124._0_8_ - auVar125._0_8_;
  auVar365._8_8_ = 0;
  auVar365._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e58.m_data[1];
  auVar125 = vfmadd231sd_fma(auVar365,auVar153,auVar325);
  auVar125 = vfmadd231sd_fma(auVar125,auVar282,auVar403);
  local_e70.m_data[1] = auVar125._0_8_ - auVar123._0_8_;
  auVar238._8_8_ = 0;
  auVar238._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e58.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar238,auVar344,auVar153);
  auVar123 = vfmadd231sd_fma(auVar123,auVar412,auVar282);
  local_e70.m_data[2] = auVar123._0_8_ - auVar122._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<
            (pCVar120," ..inv, using a ChFrame inverse and  \'*\' operator, \n");
  dVar117 = local_e58.m_data[1] - local_df8;
  auVar92._8_8_ = 0;
  auVar92._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar154._8_8_ = 0;
  auVar154._0_8_ = local_e58.m_data[0] - local_e00;
  auVar283._8_8_ = 0;
  auVar283._0_8_ =
       dVar117 * local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
  auVar122 = vfmadd231sd_fma(auVar283,auVar154,auVar92);
  auVar93._8_8_ = 0;
  auVar93._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar239._8_8_ = 0;
  auVar239._0_8_ = local_e58.m_data[2] - dStack_df0;
  auVar122 = vfmadd231sd_fma(auVar122,auVar239,auVar93);
  auVar94._8_8_ = 0;
  auVar94._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar326._8_8_ = 0;
  auVar326._0_8_ =
       dVar117 * local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [4];
  auVar123 = vfmadd231sd_fma(auVar326,auVar154,auVar94);
  auVar95._8_8_ = 0;
  auVar95._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar123 = vfmadd231sd_fma(auVar123,auVar239,auVar95);
  auVar96._8_8_ = 0;
  auVar96._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar155._8_8_ = 0;
  auVar155._0_8_ = local_e58.m_data[0] - local_e00;
  auVar198._8_8_ = 0;
  auVar198._0_8_ =
       dVar117 * local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [5];
  auVar125 = vfmadd231sd_fma(auVar198,auVar155,auVar96);
  auVar97._8_8_ = 0;
  auVar97._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar240._8_8_ = 0;
  auVar240._0_8_ = local_e58.m_data[2] - dStack_df0;
  auVar125 = vfmadd231sd_fma(auVar125,auVar240,auVar97);
  local_e70.m_data[0] = auVar122._0_8_;
  local_e70.m_data[1] = auVar123._0_8_;
  local_e70.m_data[2] = auVar125._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv, using a ChFrame \'/\' operator, \n");
  auVar156._8_8_ = 0;
  auVar156._0_8_ = local_e00;
  auVar241._8_8_ = 0;
  auVar241._0_8_ = dStack_df0;
  auVar284._8_8_ = 0;
  auVar284._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar327._8_8_ = 0;
  auVar327._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar345._8_8_ = 0;
  auVar345._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar398._8_8_ = 0;
  auVar398._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar404._8_8_ = 0;
  auVar404._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar413._8_8_ = 0;
  auVar413._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar419._8_8_ = 0;
  auVar419._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_df8;
  auVar122 = vfmadd231sd_fma(auVar419,auVar345,auVar156);
  auVar122 = vfmadd231sd_fma(auVar122,auVar413,auVar241);
  auVar428._8_8_ = 0;
  auVar428._0_8_ =
       local_df8 *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar428,auVar327,auVar156);
  auVar123 = vfmadd231sd_fma(auVar123,auVar404,auVar241);
  auVar199._8_8_ = 0;
  auVar199._0_8_ =
       local_df8 *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar125 = vfmadd231sd_fma(auVar199,auVar284,auVar156);
  auVar125 = vfmadd231sd_fma(auVar125,auVar398,auVar241);
  auVar157._8_8_ = 0;
  auVar157._0_8_ = local_e58.m_data[0];
  auVar366._8_8_ = 0;
  auVar366._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e58.m_data[1];
  auVar124 = vfmadd231sd_fma(auVar366,auVar157,auVar284);
  auVar285._8_8_ = 0;
  auVar285._0_8_ = local_e58.m_data[2];
  auVar124 = vfmadd231sd_fma(auVar124,auVar285,auVar398);
  local_e70.m_data[0] = auVar124._0_8_ - auVar125._0_8_;
  auVar367._8_8_ = 0;
  auVar367._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e58.m_data[1];
  auVar125 = vfmadd231sd_fma(auVar367,auVar157,auVar327);
  auVar125 = vfmadd231sd_fma(auVar125,auVar285,auVar404);
  local_e70.m_data[1] = auVar125._0_8_ - auVar123._0_8_;
  auVar242._8_8_ = 0;
  auVar242._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e58.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar242,auVar345,auVar157);
  auVar123 = vfmadd231sd_fma(auVar123,auVar413,auVar285);
  local_e70.m_data[2] = auVar123._0_8_ - auVar122._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv, using an inverted ChFrame \n");
  chrono::ChFrame<double>::operator*(&local_7c0.super_ChFrame<double>,&local_c20,&local_b10);
  chrono::ChFrame<double>::operator*
            (&local_d18.super_ChFrame<double>,&local_7c0.super_ChFrame<double>,&local_b98);
  auVar158._8_8_ = 0;
  auVar158._0_8_ = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  auVar243._8_8_ = 0;
  auVar243._0_8_ = local_d18.super_ChFrame<double>.coord.pos.m_data[2];
  auVar286._8_8_ = 0;
  auVar286._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar328._8_8_ = 0;
  auVar328._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar346._8_8_ = 0;
  auVar346._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar399._8_8_ = 0;
  auVar399._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar405._8_8_ = 0;
  auVar405._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar414._8_8_ = 0;
  auVar414._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar420._8_8_ = 0;
  auVar420._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  auVar122 = vfmadd231sd_fma(auVar420,auVar346,auVar158);
  auVar122 = vfmadd231sd_fma(auVar122,auVar414,auVar243);
  auVar429._8_8_ = 0;
  auVar429._0_8_ =
       local_d18.super_ChFrame<double>.coord.pos.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar429,auVar328,auVar158);
  auVar123 = vfmadd231sd_fma(auVar123,auVar405,auVar243);
  auVar200._8_8_ = 0;
  auVar200._0_8_ =
       local_d18.super_ChFrame<double>.coord.pos.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar125 = vfmadd231sd_fma(auVar200,auVar286,auVar158);
  auVar125 = vfmadd231sd_fma(auVar125,auVar399,auVar243);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = local_e38.m_data[0];
  auVar368._8_8_ = 0;
  auVar368._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e38.m_data[1];
  auVar124 = vfmadd231sd_fma(auVar368,auVar159,auVar286);
  auVar287._8_8_ = 0;
  auVar287._0_8_ = local_e38.m_data[2];
  auVar124 = vfmadd231sd_fma(auVar124,auVar287,auVar399);
  local_e70.m_data[0] = auVar124._0_8_ - auVar125._0_8_;
  auVar369._8_8_ = 0;
  auVar369._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e38.m_data[1];
  auVar125 = vfmadd231sd_fma(auVar369,auVar159,auVar328);
  auVar125 = vfmadd231sd_fma(auVar125,auVar287,auVar405);
  local_e70.m_data[1] = auVar125._0_8_ - auVar123._0_8_;
  auVar244._8_8_ = 0;
  auVar244._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e38.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar244,auVar346,auVar159);
  auVar123 = vfmadd231sd_fma(auVar123,auVar414,auVar287);
  local_e70.m_data[2] = auVar123._0_8_ - auVar122._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv three transf \n");
  local_8b8.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  auVar160._8_8_ = 0;
  auVar160._0_8_ = local_b98.coord.pos.m_data[0];
  auVar245._8_8_ = 0;
  auVar245._0_8_ = local_b98.coord.pos.m_data[2];
  local_8b8.super_ChFrame<double>.coord.rot.m_data[0] = local_b98.coord.rot.m_data[0];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_8b8.super_ChFrame<double>.coord.rot.m_data[1] = -local_b98.coord.rot.m_data[1];
  local_8b8.super_ChFrame<double>.coord.rot.m_data[2] = -local_b98.coord.rot.m_data[2];
  auVar288._0_8_ = -local_b98.coord.rot.m_data[3];
  auVar288._8_8_ = 0x8000000000000000;
  local_8b8.super_ChFrame<double>.coord.rot.m_data[3] = (double)vmovlpd_avx(auVar288);
  auVar289._8_8_ = 0;
  auVar289._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar347._8_8_ = 0;
  auVar347._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar370._8_8_ = 0;
  auVar370._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar390._8_8_ = 0;
  auVar390._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_8b8.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar380._8_8_ = 0;
  auVar380._0_8_ =
       local_b98.coord.pos.m_data[1] *
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar380,auVar160,auVar347);
  auVar98._8_8_ = 0;
  auVar98._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar245,auVar98);
  auVar348._0_8_ = auVar122._0_8_ ^ 0x8000000000000000;
  auVar348._8_8_ = auVar122._8_8_ ^ 0x8000000000000000;
  auVar381._8_8_ = 0;
  auVar381._0_8_ =
       local_b98.coord.pos.m_data[1] *
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar381,auVar160,auVar289);
  auVar122 = vfmadd231sd_fma(auVar122,auVar245,auVar390);
  auVar99._8_8_ = 0;
  auVar99._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar201._8_8_ = 0;
  auVar201._0_8_ =
       local_b98.coord.pos.m_data[1] *
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar123 = vfmadd231sd_fma(auVar201,auVar160,auVar99);
  auVar123 = vfmadd231sd_fma(auVar123,auVar370,auVar245);
  auVar122 = vunpcklpd_avx(auVar123,auVar122);
  local_8b8.super_ChFrame<double>.coord.pos.m_data[0] = -auVar122._0_8_;
  local_8b8.super_ChFrame<double>.coord.pos.m_data[1] = -auVar122._8_8_;
  local_8b8.super_ChFrame<double>.coord.pos.m_data[2] = (double)vmovlpd_avx(auVar348);
  local_658.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  auVar161._8_8_ = 0;
  auVar161._0_8_ = local_b10.coord.pos.m_data[0];
  auVar246._8_8_ = 0;
  auVar246._0_8_ = local_b10.coord.pos.m_data[2];
  local_658.super_ChFrame<double>.coord.rot.m_data[0] = local_b10.coord.rot.m_data[0];
  auVar290._8_8_ = 0;
  auVar290._0_8_ = local_b10.coord.rot.m_data[1];
  auVar329._8_8_ = 0;
  auVar329._0_8_ = local_b10.coord.rot.m_data[2];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vunpcklpd_avx(auVar290,auVar329);
  local_658.super_ChFrame<double>.coord.rot.m_data[1] = -auVar122._0_8_;
  local_658.super_ChFrame<double>.coord.rot.m_data[2] = -auVar122._8_8_;
  auVar291._0_8_ = -local_b10.coord.rot.m_data[3];
  auVar291._8_8_ = 0x8000000000000000;
  local_658.super_ChFrame<double>.coord.rot.m_data[3] = (double)vmovlpd_avx(auVar291);
  auVar292._8_8_ = 0;
  auVar292._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar349._8_8_ = 0;
  auVar349._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar371._8_8_ = 0;
  auVar371._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar391._8_8_ = 0;
  auVar391._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_658.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar382._8_8_ = 0;
  auVar382._0_8_ =
       local_b10.coord.pos.m_data[1] *
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar382,auVar161,auVar349);
  auVar100._8_8_ = 0;
  auVar100._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar246,auVar100);
  auVar350._0_8_ = auVar122._0_8_ ^ 0x8000000000000000;
  auVar350._8_8_ = auVar122._8_8_ ^ 0x8000000000000000;
  auVar383._8_8_ = 0;
  auVar383._0_8_ =
       local_b10.coord.pos.m_data[1] *
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar383,auVar161,auVar292);
  auVar122 = vfmadd231sd_fma(auVar122,auVar246,auVar391);
  auVar101._8_8_ = 0;
  auVar101._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar202._8_8_ = 0;
  auVar202._0_8_ =
       local_b10.coord.pos.m_data[1] *
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar123 = vfmadd231sd_fma(auVar202,auVar161,auVar101);
  auVar123 = vfmadd231sd_fma(auVar123,auVar371,auVar246);
  auVar122 = vunpcklpd_avx(auVar123,auVar122);
  local_a88 = 0x8000000000000000;
  uStack_a80 = 0x8000000000000000;
  local_658.super_ChFrame<double>.coord.pos.m_data[0] = -auVar122._0_8_;
  local_658.super_ChFrame<double>.coord.pos.m_data[1] = -auVar122._8_8_;
  local_658.super_ChFrame<double>.coord.pos.m_data[2] = (double)vmovlpd_avx(auVar350);
  chrono::ChFrame<double>::operator*
            (&local_7c0.super_ChFrame<double>,&local_8b8.super_ChFrame<double>,
             &local_658.super_ChFrame<double>);
  local_480.super_ChFrame<double>._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  auVar162._8_8_ = 0;
  auVar162._0_8_ = local_c20.coord.pos.m_data[0];
  auVar247._8_8_ = 0;
  auVar247._0_8_ = local_c20.coord.pos.m_data[2];
  local_480.super_ChFrame<double>.coord.rot.m_data[0] = local_c20.coord.rot.m_data[0];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  local_480.super_ChFrame<double>.coord.rot.m_data[1] =
       (double)(local_a88 ^ (ulong)local_c20.coord.rot.m_data[1]);
  local_480.super_ChFrame<double>.coord.rot.m_data[2] =
       (double)(uStack_a80 ^ (ulong)local_c20.coord.rot.m_data[2]);
  auVar293._0_8_ = local_a88 ^ (ulong)local_c20.coord.rot.m_data[3];
  auVar293._8_8_ = uStack_a80;
  local_480.super_ChFrame<double>.coord.rot.m_data[3] = (double)vmovlpd_avx(auVar293);
  auVar294._8_8_ = 0;
  auVar294._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar351._8_8_ = 0;
  auVar351._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar372._8_8_ = 0;
  auVar372._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar392._8_8_ = 0;
  auVar392._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  local_480.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar384._8_8_ = 0;
  auVar384._0_8_ =
       local_c20.coord.pos.m_data[1] *
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar384,auVar162,auVar351);
  auVar102._8_8_ = 0;
  auVar102._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar247,auVar102);
  auVar352._0_8_ = local_a88 ^ auVar122._0_8_;
  auVar352._8_8_ = uStack_a80 ^ auVar122._8_8_;
  auVar385._8_8_ = 0;
  auVar385._0_8_ =
       local_c20.coord.pos.m_data[1] *
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar385,auVar162,auVar294);
  auVar122 = vfmadd231sd_fma(auVar122,auVar247,auVar392);
  auVar103._8_8_ = 0;
  auVar103._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar203._8_8_ = 0;
  auVar203._0_8_ =
       local_c20.coord.pos.m_data[1] *
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar123 = vfmadd231sd_fma(auVar203,auVar162,auVar103);
  auVar123 = vfmadd231sd_fma(auVar123,auVar372,auVar247);
  auVar122 = vunpcklpd_avx(auVar123,auVar122);
  local_480.super_ChFrame<double>.coord.pos.m_data[0] = (double)(local_a88 ^ auVar122._0_8_);
  local_480.super_ChFrame<double>.coord.pos.m_data[1] = (double)(uStack_a80 ^ auVar122._8_8_);
  local_480.super_ChFrame<double>.coord.pos.m_data[2] = (double)vmovlpd_avx(auVar352);
  chrono::ChFrame<double>::operator*
            (&local_d18.super_ChFrame<double>,&local_7c0.super_ChFrame<double>,
             &local_480.super_ChFrame<double>);
  auVar163._8_8_ = 0;
  auVar163._0_8_ = local_e38.m_data[0];
  auVar104._8_8_ = 0;
  auVar104._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar248._8_8_ = 0;
  auVar248._0_8_ =
       local_e38.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar248,auVar163,auVar104);
  auVar295._8_8_ = 0;
  auVar295._0_8_ = local_e38.m_data[2];
  auVar105._8_8_ = 0;
  auVar105._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar295,auVar105);
  local_e70.m_data[0] = auVar122._0_8_ + local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  auVar106._8_8_ = 0;
  auVar106._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar330._8_8_ = 0;
  auVar330._0_8_ =
       local_e38.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar330,auVar163,auVar106);
  auVar107._8_8_ = 0;
  auVar107._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar295,auVar107);
  local_e70.m_data[1] = auVar122._0_8_ + local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  auVar108._8_8_ = 0;
  auVar108._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar204._8_8_ = 0;
  auVar204._0_8_ =
       local_e38.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar204,auVar163,auVar108);
  auVar109._8_8_ = 0;
  auVar109._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar295,auVar109);
  local_e70.m_data[2] = auVar122._0_8_ + local_d18.super_ChFrame<double>.coord.pos.m_data[2];
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv three transf (another method) \n");
  chrono::ChFrame<double>::operator>>(&local_7c0.super_ChFrame<double>,&local_b98,&local_b10);
  chrono::ChFrame<double>::operator>>
            (&local_d18.super_ChFrame<double>,&local_7c0.super_ChFrame<double>,&local_c20);
  auVar164._8_8_ = 0;
  auVar164._0_8_ = local_d18.super_ChFrame<double>.coord.pos.m_data[0];
  auVar249._8_8_ = 0;
  auVar249._0_8_ = local_d18.super_ChFrame<double>.coord.pos.m_data[2];
  auVar296._8_8_ = 0;
  auVar296._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar331._8_8_ = 0;
  auVar331._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar353._8_8_ = 0;
  auVar353._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar400._8_8_ = 0;
  auVar400._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar406._8_8_ = 0;
  auVar406._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar415._8_8_ = 0;
  auVar415._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar421._8_8_ = 0;
  auVar421._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_d18.super_ChFrame<double>.coord.pos.m_data[1];
  auVar122 = vfmadd231sd_fma(auVar421,auVar353,auVar164);
  auVar122 = vfmadd231sd_fma(auVar122,auVar415,auVar249);
  auVar430._8_8_ = 0;
  auVar430._0_8_ =
       local_d18.super_ChFrame<double>.coord.pos.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar430,auVar331,auVar164);
  auVar123 = vfmadd231sd_fma(auVar123,auVar406,auVar249);
  auVar205._8_8_ = 0;
  auVar205._0_8_ =
       local_d18.super_ChFrame<double>.coord.pos.m_data[1] *
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar125 = vfmadd231sd_fma(auVar205,auVar296,auVar164);
  auVar125 = vfmadd231sd_fma(auVar125,auVar400,auVar249);
  auVar165._8_8_ = 0;
  auVar165._0_8_ = local_e38.m_data[0];
  auVar373._8_8_ = 0;
  auVar373._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e38.m_data[1];
  auVar124 = vfmadd231sd_fma(auVar373,auVar165,auVar296);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = local_e38.m_data[2];
  auVar124 = vfmadd231sd_fma(auVar124,auVar297,auVar400);
  local_e70.m_data[0] = auVar124._0_8_ - auVar125._0_8_;
  auVar374._8_8_ = 0;
  auVar374._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e38.m_data[1];
  auVar125 = vfmadd231sd_fma(auVar374,auVar165,auVar331);
  auVar125 = vfmadd231sd_fma(auVar125,auVar297,auVar406);
  local_e70.m_data[1] = auVar125._0_8_ - auVar123._0_8_;
  auVar250._8_8_ = 0;
  auVar250._0_8_ =
       local_d18.super_ChFrame<double>.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e38.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar250,auVar353,auVar165);
  auVar123 = vfmadd231sd_fma(auVar123,auVar415,auVar297);
  local_e70.m_data[2] = auVar123._0_8_ - auVar122._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv three transf (another method) \n");
  auVar166._8_8_ = 0;
  auVar166._0_8_ = local_c20.coord.pos.m_data[0];
  auVar251._8_8_ = 0;
  auVar251._0_8_ = local_c20.coord.pos.m_data[2];
  auVar298._8_8_ = 0;
  auVar298._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar332._8_8_ = 0;
  auVar332._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar354._8_8_ = 0;
  auVar354._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar401._8_8_ = 0;
  auVar401._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar407._8_8_ = 0;
  auVar407._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar416._8_8_ = 0;
  auVar416._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar422._8_8_ = 0;
  auVar422._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_c20.coord.pos.m_data[1];
  auVar122 = vfmadd231sd_fma(auVar422,auVar354,auVar166);
  auVar122 = vfmadd231sd_fma(auVar122,auVar416,auVar251);
  auVar431._8_8_ = 0;
  auVar431._0_8_ =
       local_c20.coord.pos.m_data[1] *
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar123 = vfmadd231sd_fma(auVar431,auVar332,auVar166);
  auVar123 = vfmadd231sd_fma(auVar123,auVar407,auVar251);
  auVar206._8_8_ = 0;
  auVar206._0_8_ =
       local_c20.coord.pos.m_data[1] *
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar125 = vfmadd231sd_fma(auVar206,auVar298,auVar166);
  auVar125 = vfmadd231sd_fma(auVar125,auVar401,auVar251);
  auVar167._8_8_ = 0;
  auVar167._0_8_ = local_e38.m_data[0];
  auVar375._8_8_ = 0;
  auVar375._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_e38.m_data[1];
  auVar124 = vfmadd231sd_fma(auVar375,auVar167,auVar298);
  auVar299._8_8_ = 0;
  auVar299._0_8_ = local_e38.m_data[2];
  auVar124 = vfmadd231sd_fma(auVar124,auVar299,auVar401);
  dVar117 = auVar124._0_8_ - auVar125._0_8_;
  auVar376._8_8_ = 0;
  auVar376._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       local_e38.m_data[1];
  auVar125 = vfmadd231sd_fma(auVar376,auVar167,auVar332);
  auVar125 = vfmadd231sd_fma(auVar125,auVar299,auVar407);
  dVar259 = auVar125._0_8_ - auVar123._0_8_;
  auVar252._8_8_ = 0;
  auVar252._0_8_ =
       local_c20.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_e38.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar252,auVar354,auVar167);
  auVar123 = vfmadd231sd_fma(auVar123,auVar416,auVar299);
  dVar118 = auVar123._0_8_ - auVar122._0_8_;
  auVar253._8_8_ = 0;
  auVar253._0_8_ = local_b10.coord.pos.m_data[0];
  auVar300._8_8_ = 0;
  auVar300._0_8_ = local_b10.coord.pos.m_data[1];
  auVar355._8_8_ = 0;
  auVar355._0_8_ = local_b10.coord.pos.m_data[2];
  auVar377._8_8_ = 0;
  auVar377._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar386._8_8_ = 0;
  auVar386._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar393._8_8_ = 0;
  auVar393._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar408._8_8_ = 0;
  auVar408._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar423._8_8_ = 0;
  auVar423._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar432._8_8_ = 0;
  auVar432._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar434._8_8_ = 0;
  auVar434._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar437._8_8_ = 0;
  auVar437._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_b10.coord.pos.m_data[1];
  auVar122 = vfmadd231sd_fma(auVar437,auVar393,auVar253);
  auVar122 = vfmadd231sd_fma(auVar122,auVar434,auVar355);
  auVar123 = vmulsd_avx512f(auVar300,auVar408);
  auVar123 = vfmadd231sd_avx512f(auVar123,auVar386,auVar253);
  auVar124 = vfmadd231sd_avx512f(auVar123,auVar432,auVar355);
  auVar301._8_8_ = 0;
  auVar301._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_b10.coord.pos.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar301,auVar377,auVar253);
  auVar123 = vfmadd231sd_fma(auVar123,auVar423,auVar355);
  auVar207._8_8_ = 0;
  auVar207._0_8_ = dVar117;
  auVar254._8_8_ = 0;
  auVar254._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       dVar259;
  auVar125 = vfmadd231sd_fma(auVar254,auVar207,auVar377);
  auVar168._8_8_ = 0;
  auVar168._0_8_ = dVar118;
  auVar125 = vfmadd231sd_fma(auVar125,auVar168,auVar423);
  dVar116 = auVar125._0_8_ - auVar123._0_8_;
  auVar302._8_8_ = 0;
  auVar302._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       dVar259;
  auVar123 = vfmadd231sd_fma(auVar302,auVar207,auVar386);
  auVar123 = vfmadd231sd_fma(auVar123,auVar168,auVar432);
  auVar125 = vsubsd_avx512f(auVar123,auVar124);
  auVar208._8_8_ = 0;
  auVar208._0_8_ = dVar117;
  auVar333._8_8_ = 0;
  auVar333._0_8_ =
       local_b10.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar259;
  auVar123 = vfmadd231sd_fma(auVar333,auVar393,auVar208);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = dVar118;
  auVar123 = vfmadd231sd_fma(auVar123,auVar434,auVar169);
  dVar117 = auVar123._0_8_ - auVar122._0_8_;
  auVar209._8_8_ = 0;
  auVar209._0_8_ = local_b98.coord.pos.m_data[0];
  auVar334._8_8_ = 0;
  auVar334._0_8_ = local_b98.coord.pos.m_data[1];
  auVar356._8_8_ = 0;
  auVar356._0_8_ = local_b98.coord.pos.m_data[2];
  auVar378._8_8_ = 0;
  auVar378._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar387._8_8_ = 0;
  auVar387._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar394._8_8_ = 0;
  auVar394._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar409._8_8_ = 0;
  auVar409._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar424._8_8_ = 0;
  auVar424._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar433._8_8_ = 0;
  auVar433._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar435._8_8_ = 0;
  auVar435._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar438._8_8_ = 0;
  auVar438._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       local_b98.coord.pos.m_data[1];
  auVar122 = vfmadd231sd_fma(auVar438,auVar394,auVar209);
  auVar122 = vfmadd231sd_fma(auVar122,auVar435,auVar356);
  auVar123 = vmulsd_avx512f(auVar334,auVar409);
  auVar123 = vfmadd231sd_avx512f(auVar123,auVar387,auVar209);
  auVar124 = vfmadd231sd_avx512f(auVar123,auVar433,auVar356);
  auVar335._8_8_ = 0;
  auVar335._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       local_b98.coord.pos.m_data[1];
  auVar123 = vfmadd231sd_fma(auVar335,auVar378,auVar209);
  auVar123 = vfmadd231sd_fma(auVar123,auVar424,auVar356);
  dVar259 = auVar125._0_8_;
  auVar210._8_8_ = 0;
  auVar210._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] *
       dVar259;
  auVar255._8_8_ = 0;
  auVar255._0_8_ = dVar116;
  auVar125 = vfmadd231sd_fma(auVar210,auVar255,auVar378);
  auVar170._8_8_ = 0;
  auVar170._0_8_ = dVar117;
  auVar125 = vfmadd231sd_fma(auVar125,auVar170,auVar424);
  local_e70.m_data[0] = auVar125._0_8_ - auVar123._0_8_;
  auVar336._8_8_ = 0;
  auVar336._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] *
       dVar259;
  auVar123 = vfmadd231sd_fma(auVar336,auVar255,auVar387);
  auVar123 = vfmadd231sd_fma(auVar123,auVar170,auVar433);
  auVar125 = vsubsd_avx512f(auVar123,auVar124);
  auVar256._8_8_ = 0;
  auVar256._0_8_ = dVar116;
  auVar303._8_8_ = 0;
  auVar303._0_8_ =
       local_b98.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] *
       dVar259;
  auVar123 = vfmadd231sd_fma(auVar303,auVar394,auVar256);
  auVar171._8_8_ = 0;
  auVar171._0_8_ = dVar117;
  auVar123 = vfmadd231sd_fma(auVar123,auVar435,auVar171);
  local_e70.m_data[2] = auVar123._0_8_ - auVar122._0_8_;
  local_e70.m_data[1] = auVar125._0_8_;
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_e70);
  chrono::ChStreamOutAscii::operator<<(pCVar120," ..inv three transf (another method) \n");
  local_940._vptr_ChFrame = (_func_int **)&PTR__ChFrame_0011e7b8;
  local_940.coord.pos.m_data[0] = local_e20.m_data[0];
  local_940.coord.pos.m_data[1] = local_e20.m_data[1];
  local_940.coord.pos.m_data[2] = local_e20.m_data[2];
  local_940.coord.rot.m_data[0] = local_d38.m_data[0];
  local_940.coord.rot.m_data[1] = local_d38.m_data[1];
  local_940.coord.rot.m_data[2] = local_d38.m_data[2];
  local_940.coord.rot.m_data[3] = local_d38.m_data[3];
  chrono::ChMatrix33<double>::ChMatrix33(&local_940.Amatrix,&local_d38);
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_d18,&local_e20,&local_d38);
  chrono::operator*(&local_b8,&local_d18,&local_940);
  chrono::operator*(&local_7c0,&local_940,&local_d18);
  chrono::ChFrame<double>::ConcatenatePreTransformation(&local_940,&local_c20);
  local_940.coord.pos.m_data[0] = local_940.coord.pos.m_data[0] + 1.0;
  local_940.coord.pos.m_data[1] = local_940.coord.pos.m_data[1] + 2.0;
  local_940.coord.pos.m_data[2] = local_940.coord.pos.m_data[2] + 3.0;
  chrono::Q_from_AngAxis(0.5235987755982988,(ChVector *)&local_8b8);
  chrono::ChFrame<double>::operator>>=(&local_940,(ChQuaternion<double> *)&local_8b8);
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar120," %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n");
  dVar117 = local_d38.m_data[0] * local_d38.m_data[0];
  auVar123 = ZEXT816(0xbff0000000000000);
  auVar125 = ZEXT816(0x4000000000000000);
  auVar304._8_8_ = 0;
  auVar304._0_8_ = dVar117 + local_d38.m_data[1] * local_d38.m_data[1];
  auVar122 = vfmadd213sd_fma(auVar304,auVar125,auVar123);
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar122._0_8_;
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_d38.m_data[1] * local_d38.m_data[2] - local_d38.m_data[0] * local_d38.m_data[3];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] +
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_d38.m_data[0] * local_d38.m_data[2] + local_d38.m_data[1] * local_d38.m_data[3];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] +
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_d38.m_data[1] * local_d38.m_data[2] + local_d38.m_data[0] * local_d38.m_data[3];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] +
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar172._8_8_ = 0;
  auVar172._0_8_ = dVar117 + local_d38.m_data[2] * local_d38.m_data[2];
  auVar122 = vfmadd213sd_fma(auVar172,auVar125,auVar123);
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar122._0_8_;
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_d38.m_data[2] * local_d38.m_data[3] - local_d38.m_data[0] * local_d38.m_data[1];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] +
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_d38.m_data[1] * local_d38.m_data[3] - local_d38.m_data[0] * local_d38.m_data[2];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] +
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_d38.m_data[0] * local_d38.m_data[1] + local_d38.m_data[2] * local_d38.m_data[3];
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] +
       local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar173._8_8_ = 0;
  auVar173._0_8_ = dVar117 + local_d38.m_data[3] * local_d38.m_data[3];
  auVar122 = vfmadd213sd_fma(auVar173,auVar125,auVar123);
  local_d80.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar122._0_8_;
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_8b8,&local_e20,&local_d38);
  local_8b8.coord_dt.pos.m_data[0] = 0.5;
  local_8b8.coord_dt.pos.m_data[1] = 0.6;
  local_8b8.coord_dt.pos.m_data[2] = 0.7;
  local_658.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff199999999999a;
  local_658.super_ChFrame<double>.coord.pos.m_data[0] = 2.1;
  local_658.super_ChFrame<double>.coord.pos.m_data[1] = 5.1;
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_8b8,(ChVector<double> *)&local_658);
  local_8b8.coord_dtdt.pos.m_data[0] = 7.0;
  local_8b8.coord_dtdt.pos.m_data[1] = 8.0;
  local_8b8.coord_dtdt.pos.m_data[2] = 9.0;
  local_658.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x4011333333333333;
  local_658.super_ChFrame<double>.coord.pos.m_data[0] = 5.3;
  local_658.super_ChFrame<double>.coord.pos.m_data[1] = 2.3;
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_8b8,(ChVector<double> *)&local_658);
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_8b8);
  chrono::ChStreamOutAscii::operator<<(pCVar120,"a moving frame");
  local_670.m_data[0] = 0.1;
  local_670.m_data[1] = 3.1;
  local_670.m_data[2] = 1.1;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_658,&local_670,(ChQuaternion<double> *)&chrono::QUNIT);
  local_658.coord_dt.pos.m_data[0] = 3.2;
  local_658.coord_dt.pos.m_data[1] = 9.2;
  local_658.coord_dt.pos.m_data[2] = 7.2;
  local_658.coord_dt.rot.m_data[0] = local_d38.m_data[0];
  local_658.coord_dt.rot.m_data[1] = local_d38.m_data[1];
  local_658.coord_dt.rot.m_data[2] = local_d38.m_data[2];
  local_658.coord_dt.rot.m_data[3] = local_d38.m_data[3];
  local_480.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3fd999999999999a;
  local_480.super_ChFrame<double>.coord.pos.m_data[0] = 0.5;
  local_480.super_ChFrame<double>.coord.pos.m_data[1] = 0.6;
  chrono::ChFrameMoving<double>::SetWvel_loc(&local_658,(ChVector<double> *)&local_480);
  local_658.coord_dtdt.pos.m_data[0] = 5.3;
  local_658.coord_dtdt.pos.m_data[1] = 3.3;
  local_658.coord_dtdt.pos.m_data[2] = 2.3;
  local_480.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3fdb851eb851eb85;
  local_480.super_ChFrame<double>.coord.pos.m_data[0] = 0.53;
  local_480.super_ChFrame<double>.coord.pos.m_data[1] = 0.63;
  chrono::ChFrameMoving<double>::SetWacc_loc(&local_658,(ChVector<double> *)&local_480);
  local_388.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_388.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x0;
  local_388.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_1b0.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_1b0.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_1b0.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_1b0.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_480,(ChVector<double> *)&local_388,(ChQuaternion<double> *)&local_1b0);
  local_968.m_data[2] = 0.0;
  local_968.m_data[0] = 0.0;
  local_968.m_data[1] = 0.0;
  local_388.super_ChFrame<double>._vptr_ChFrame = (_func_int **)0x3ff0000000000000;
  local_388.super_ChFrame<double>.coord.pos.m_data[0] = 0.0;
  local_388.super_ChFrame<double>.coord.pos.m_data[1] = 0.0;
  local_388.super_ChFrame<double>.coord.pos.m_data[2] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving
            (&local_1b0,(ChVector<double> *)&local_968,(ChQuaternion<double> *)&local_388);
  chrono::ChFrameMoving<double>::TransformLocalToParent(&local_8b8,&local_658,&local_480);
  local_688.m_data[2] = 0.0;
  local_688.m_data[0] = 0.0;
  local_688.m_data[1] = 0.0;
  local_968.m_data[0] = 1.0;
  local_968.m_data[1] = 0.0;
  local_968.m_data[2] = 0.0;
  local_968.m_data[3] = 0.0;
  chrono::ChFrameMoving<double>::ChFrameMoving(&local_388,&local_688,&local_968);
  chrono::ChFrameMoving<double>::TransformLocalToParent(&local_8b8,&local_658,&local_388);
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = chrono::operator<<(pCVar120,&local_388);
  chrono::ChStreamOutAscii::operator<<(pCVar120," trasf loc->abs \n");
  std::chrono::_V2::system_clock::now();
  iVar121 = 1000000;
  do {
    chrono::ChFrameMoving<double>::TransformLocalToParent(&local_8b8,&local_658,&local_480);
    iVar121 = iVar121 + -1;
  } while (iVar121 != 0);
  std::chrono::_V2::system_clock::now();
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar120,"TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: ")
  ;
  pCVar120 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar120,NAN);
  chrono::ChStreamOutAscii::operator<<(pCVar120," \n");
  std::chrono::_V2::system_clock::now();
  auVar174._8_8_ = 0;
  auVar174._0_8_ = local_e70.m_data[0];
  auVar110._8_8_ = 0;
  auVar110._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  auVar257._8_8_ = 0;
  auVar257._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar122 = vfmadd231sd_fma(auVar257,auVar174,auVar110);
  auVar305._8_8_ = 0;
  auVar305._0_8_ = local_e70.m_data[2];
  auVar111._8_8_ = 0;
  auVar111._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  auVar122 = vfmadd231sd_fma(auVar122,auVar305,auVar111);
  local_e58.m_data[0] = auVar122._0_8_ + local_e00;
  auVar112._8_8_ = 0;
  auVar112._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3];
  auVar337._8_8_ = 0;
  auVar337._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
  auVar122 = vfmadd231sd_fma(auVar337,auVar174,auVar112);
  auVar113._8_8_ = 0;
  auVar113._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
  auVar122 = vfmadd231sd_fma(auVar122,auVar305,auVar113);
  local_e58.m_data[1] = auVar122._0_8_ + local_df8;
  auVar114._8_8_ = 0;
  auVar114._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6];
  auVar211._8_8_ = 0;
  auVar211._0_8_ =
       local_e70.m_data[1] *
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
  auVar122 = vfmadd231sd_fma(auVar211,auVar174,auVar114);
  auVar115._8_8_ = 0;
  auVar115._0_8_ =
       local_dc8.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
  auVar122 = vfmadd231sd_fma(auVar122,auVar305,auVar115);
  local_e58.m_data[2] = auVar122._0_8_ + dStack_df0;
  std::chrono::_V2::system_clock::now();
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar120,"TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)");
  pCVar120 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar120,NAN);
  chrono::ChStreamOutAscii::operator<<(pCVar120," \n");
  std::chrono::_V2::system_clock::now();
  iVar121 = 1000000;
  do {
    chrono::ChFrameMoving<double>::PointAccelerationParentToLocal
              ((ChVector<double> *)&local_968,&local_8b8,&local_e20,&local_e20,&local_e20);
    iVar121 = iVar121 + -1;
  } while (iVar121 != 0);
  std::chrono::_V2::system_clock::now();
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  pCVar120 = (ChStreamOutAscii *)
             chrono::ChStreamOutAscii::operator<<
                       (pCVar120,"TEST 10e6 of PointAccelerationParentToLocal (0.811)");
  pCVar120 = (ChStreamOutAscii *)chrono::ChStreamOutAscii::operator<<(pCVar120,NAN);
  chrono::ChStreamOutAscii::operator<<(pCVar120," \n");
  pCVar120 = (ChStreamOutAscii *)chrono::GetLog();
  chrono::ChStreamOutAscii::operator<<(pCVar120,"\n  CHRONO execution terminated.");
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    GetLog() << "Copyright (c) 2017 projectchrono.org\nChrono version: " << CHRONO_VERSION << "\n\n";

    // To write something to the console, use the chrono::GetLog()
    GetLog() << "CHRONO demo about coordinate transformations: \n\n";

    //
    // Some methods to achieve coordinate transformations, and some
    // examples of how to manipulate coordinates and frames, using Chrono features.
    //
    // You can use ChTransform or ChChCoordsys<> or ChFrame functions to transform points
    // from/to local coordinates in 3D, in ascending complexity and capabilities.
    //

    ChVector<> mvect2;  // resulting (transformed) vectors will go here
    ChVector<> mvect3;

    // Define a  POINT  to be transformed, expressed in
    // local frame coordinate.
    ChVector<> mvect1(2, 3, 4);

    // Define a vector representing the TRANSLATION of the frame
    // respect to absolute (world) coordinates.
    ChVector<> vtraslA(5, 6, 7);

    // Define a quaternion representing the ROTATION of the frame
    // respect to absolute (world) coordinates. Must be normalized.
    ChQuaternion<> qrotA(1, 3, 4, 5);
    qrotA.Normalize();

    // ..Also create a 3x3 rotation matrix [A] from the quaternion
    // (at any time you can use mrotA.Set_A_quaternion(qrotA) );
    ChMatrix33<> mrotA(qrotA);

    // ..Also create a ChCoordsys<>tem object, representing both
    // translation and rotation.
    ChCoordsys<> csysA(vtraslA, qrotA);

    // OK!!! Now we are ready to perform the transformation, like in
    // linear algebra formula v'=t+[A]*v, so that we will obtain
    // the coordinates of mvect1 in absolute coordinates.
    // This can be achieved in many ways. Let's see them.

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //
    mvect2 = vtraslA + mrotA * mvect1;  // like:  v2 = t + [A]*v1
    GetLog() << mvect2 << " ..using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect2 = vtraslA + qrotA.Rotate(mvect1);
    GetLog() << mvect2 << " ..using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, mrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and rot.matrix, \n";

    mvect2 = ChTransform<>::TransformLocalToParent(mvect1, vtraslA, qrotA);
    GetLog() << mvect2 << " ..using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect2 = csysA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChChCoordsys<> object, \n";

    mvect2 = mvect1 >> csysA;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '>>' operator, \n";

    mvect2 = csysA * mvect1;
    GetLog() << mvect2 << " ..using a ChChCoordsys<> '*' operator, \n";

    // TRANSFORM USING A ChFrame OBJECT

    ChFrame<> mframeA(vtraslA, qrotA);  // or ChFrame<> mframeA(csysA);

    mvect2 = mframeA.TransformLocalToParent(mvect1);
    GetLog() << mvect2 << " ..using a ChFrame object function, \n";

    mvect2 = mvect1 >> mframeA;
    GetLog() << mvect2 << " ..using a ChFrame '>>' operator, \n";

    mvect2 = mframeA * mvect1;
    GetLog() << mvect2 << " ..using a ChFrame '*' operator, \n";

    //
    // Now perform transformations in a chain of frames, in
    // sequence.
    //

    ChVector<> v10(5, 6, 7);
    ChQuaternion<> q10(1, 3, 4, 5);
    q10.Normalize();
    ChMatrix33<> m10(q10);

    ChVector<> v21(4, 1, 3);
    ChQuaternion<> q21(3, 2, 1, 5);
    q21.Normalize();
    ChMatrix33<> m21(q21);

    ChVector<> v32(1, 5, 1);
    ChQuaternion<> q32(4, 1, 3, 1);
    q32.Normalize();
    ChMatrix33<> m32(q32);

    // ...with linear algebra:

    mvect3 = v10 + m10 * (v21 + m21 * (v32 + m32 * mvect1));
    GetLog() << mvect3 << " ..triple trsf. using linear algebra, \n";

    // ...with ChFrame '>>' operator or "*" operator
    // is by far much simplier!

    ChFrame<> f10(v10, q10);
    ChFrame<> f21(v21, q21);
    ChFrame<> f32(v32, q32);

    mvect3 = mvect1 >> f32 >> f21 >> f10;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '>>' operator, \n";

    mvect3 = f10 * f21 * f32 * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    ChFrame<> tempf(f10 * f21 * f32);
    mvect3 = tempf * mvect1;
    GetLog() << mvect3 << " ..triple vector trsf. with ChFrame '*' operator, \n";

    // Not only vectors, but also ChFrame can be transformed
    // with ">>" or "*" operators.

    ChFrame<> f_3(mvect1);
    ChFrame<> f_0;
    f_0 = f_3 >> f32 >> f21 >> f10;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '>>' operator,  \n";

    f_0 = f10 * f21 * f32 * f_3;
    GetLog() << f_0 << " ..triple frame trsf. with ChFrame '*' operator,  \n";

    // Test the  ">>" or "*" operators also for ChCoordsys:
    ChCoordsys<> c_0;
    c_0 = f_3.GetCoord() >> f32.GetCoord() >> f21.GetCoord() >> f10.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '>>' operator,  \n";

    c_0 = f10.GetCoord() * f21.GetCoord() * f32.GetCoord() * f_3.GetCoord();
    GetLog() << f_0 << " ..triple frame trsf. with ChCoordsys '*' operator,  \n";

    //
    // Now test inverse transformations too.
    //
    // From the low-level to the higher level methods, here are some
    // ways to accomplish this.
    //

    // TRANSFORM USING ROTATION MATRIX AND LINEAR ALGEBRA
    //

    GetLog() << mvect1 << " ..mvect1 \n";
    mvect1 = mrotA.transpose() * (mvect2 - vtraslA);  // like:  v1 = [A]'*(v2-t)
    GetLog() << mvect1 << " ..inv, using linear algebra, \n";

    // TRANSFORM USING QUATERNION ROTATION

    mvect1 = qrotA.RotateBack(mvect2 - vtraslA);
    GetLog() << mvect1 << " ..inv, using quaternion rotation, \n";

    // TRANSFORM USING THE ChTransform STATIC METHODS

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, mrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and rot.matrix, \n";

    mvect1 = ChTransform<>::TransformParentToLocal(mvect2, vtraslA, qrotA);
    GetLog() << mvect1 << " ..inv, using the ChTransform- vect and quat, \n";

    // TRANSFORM USING A ChCoordys OBJECT

    mvect1 = csysA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChChCoordsys<> object, \n";

    // TRANSFORM USING A ChFrame OBJECT

    mvect1 = mframeA.TransformParentToLocal(mvect2);
    GetLog() << mvect1 << " ..inv, using a ChFrame object function, \n";

    mvect1 = mvect2 >> mframeA.GetInverse();
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and '>>' operator, \n";

    mvect1 = mframeA.GetInverse() * mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame inverse and  '*' operator, \n";

    mvect1 = mframeA / mvect2;
    GetLog() << mvect1 << " ..inv, using a ChFrame '/' operator, \n";

    ChFrame<> mframeAinv(mframeA);
    mframeAinv.Invert();
    mvect1 = mframeAinv * mvect2;
    GetLog() << mvect1 << " ..inv, using an inverted ChFrame \n";

    // ... also for inverting chain of transformations...

    // mvect3 =  f10 * f21 * f32 * mvect1;				// direct transf..

    mvect1 = (f10 * f21 * f32).GetInverse() * mvect3;  // inverse transf.
    GetLog() << mvect1 << " ..inv three transf \n";

    mvect1 = f32.GetInverse() * f21.GetInverse() * f10.GetInverse() * mvect3;
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> (f32 >> f21 >> f10).GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    mvect1 = mvect3 >> f10.GetInverse() >> f21.GetInverse() >> f32.GetInverse();
    GetLog() << mvect1 << " ..inv three transf (another method) \n";

    //
    // Now test the * and >> operators with some mixed-types operators
    //

    ChFrame<> mframeA1(vtraslA, qrotA);
    ChFrameMoving<> mframemovingB1(vtraslA, qrotA);
    ChFrame<> mresf = mframemovingB1 * mframeA1;
    ChFrameMoving<> mresg = mframeA1 * mframemovingB1;

    //
    // Test some in-place operators, even with mixed-types. Some examples.
    //

    // Transform mframeA1 by rotating & translating by another frame,
    // using the in-place >>= operator, as in  A >>= B,
    // that means:   frameA' = frameA >> frameB  = frameB * frameA
    mframeA1 >>= f10;

    // Transform mframeA1 by translating by a vector:
    mframeA1 >>= ChVector<>(1, 2, 3);

    // Transform mframeA1 by rotating it 30 degrees on axis Y, using a quaternion:
    mframeA1 >>= Q_from_AngAxis(30 * CH_C_DEG_TO_RAD, VECT_Y);

    //
    // BENCHMARK FOR EXECUTION SPEED
    //

    GetLog() << " %%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%%% \n\n";

    mrotA.Set_A_quaternion(qrotA);
    ChFpMatrix34<> Fp(qrotA);
    ChFmMatrix34<> Fm(qrotA);
    ChGlMatrix34<> Gl(qrotA);
    ChGwMatrix34<> Gw(qrotA);

    ChFrameMoving<> testa(vtraslA, qrotA);
    testa.SetPos_dt(ChVector<>(0.5, 0.6, 0.7));
    testa.SetWvel_loc(ChVector<>(1.1, 2.1, 5.1));
    testa.SetPos_dtdt(ChVector<>(7, 8, 9));
    testa.SetWacc_loc(ChVector<>(4.3, 5.3, 2.3));
    GetLog() << testa << "a moving frame";

    ChVector<> locpos(0.1, 3.1, 1.1);
    ChVector<> locspeed(3.2, 9.2, 7.2);
    ChVector<> locacc(5.3, 3.3, 2.3);

    ChFrameMoving<> testPl(locpos, QUNIT);
    testPl.SetPos_dt(locspeed);
    testPl.SetRot_dt(qrotA);
    testPl.SetWvel_loc(ChVector<>(0.4, 0.5, 0.6));
    testPl.SetPos_dtdt(locacc);
    testPl.SetWacc_loc(ChVector<>(0.43, 0.53, 0.63));
    ChFrameMoving<> testPw;
    ChFrameMoving<> testX;
    testa.TransformLocalToParent(testPl, testPw);

    ChFrameMoving<> bres = (testPl >> testa);

    GetLog() << bres << " trasf loc->abs \n";

    ChQuaternion<> pollo(3, 5, 6, 7);
    ChVector<> pallo(2, 4, 6);

    ChTimer<double> timer;

    //int numcycles = 100000;
    int i;

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.TransformLocalToParent(testPl, testPw);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of ChFrameMoving::TransformLocalToParent (1.38) Time: " << timer() << " \n";
    // VC6   : 1.380
    // VC2003: 0.861
    // VC2005: 0.691
    // GCC   : 0.661

    timer.start();
    for (i = 0; i < 1000000; i++) {
        mvect2 = mvect1 >> mframeA;
    }
    timer.stop();
    GetLog() << "TEST 10e6 of mvect2 = mvect1 >> mframeA; (0.03)" << timer() << " \n";
    // VC6   : 0.03
    // VC2003: 0.03
    // VC2005: 0.03
    // GCC   : 0.03

    timer.start();
    for (i = 0; i < 1000000; i++) {
        testa.PointAccelerationParentToLocal(vtraslA, vtraslA, vtraslA);
    }
    timer.stop();
    GetLog() << "TEST 10e6 of PointAccelerationParentToLocal (0.811)" << timer() << " \n";
    // VC6   : 0.811
    // VC2003: 0.531
    // VC2005: 0.410
    // GCC   : 0.320

    /*
       timer.start();
       for (i= 0; i<numcycles; i++)
       {
           for (int j = 0; j<100; j++)
           {
               mvect2 = mvect1 >> f32 >> f21 >> f10;
               // NOTE: thank to the fact that operators are executed from left to
               // right, the above is MUCH faster (16x) than the equivalent:
               //    mvect2 =  f10 * f21 * f32 * mvect1;
               // because the latter, if no parenthesis are used, would imply
               // three expensive frame*frame operations, and a last frame*vector.
           }
       }
       timer.stop();
       GetLog() << "Test 3 frame transf. with >> ChFrame operator: " <<  timer() << " \n";


       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetCoord(vtraslA,qrotA);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetPos() " <<  timer() << " \n";


   //ChQuaternion<> mqdt(1, 2, 3, 4);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dt(mqdt);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetRot_dt() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetRot_dtdt(mqdt);
       }
       timer.stop()
       GetLog() << "Test ChFrame::SetRot_dtdt() " <<  timer() << " \n";


   ChVector<> mv(1, 2, 3);
       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWvel_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           testa.SetWacc_loc(mv);
       }
       timer.stop();
       GetLog() << "Test ChFrame::SetWacc_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           Vector p= testa.GetWvel_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWvel_loc() " <<  timer() << " \n";

       timer.start();
       for (i= 0; i<1000000; i++)
       {
           ChVector<> p= testa.GetWacc_loc();
       }
       timer.stop();
       GetLog() << "Test ChFrame::GetWacc_loc() " <<  timer() << " \n";


   */

    GetLog() << "\n  CHRONO execution terminated.";

    return 0;
}